

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O0

void __thiscall daw::curl_wrapper::reset(curl_wrapper *this)

{
  pointer piVar1;
  CURL *__p;
  curl_wrapper *this_local;
  
  piVar1 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(&this->m_impl);
  impl_t::reset(piVar1);
  piVar1 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(&this->m_impl);
  __p = cw_details::anon_unknown_0::init_curl();
  std::unique_ptr<void,_daw::cw_details::curl_deleter>::reset(&piVar1->curl,__p);
  return;
}

Assistant:

void curl_wrapper::reset( ) {
		m_impl->reset( );
		m_impl->curl.reset( cw_details::init_curl( ) );
	}